

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

int v3_check_critical(char **value)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  byte *local_20;
  char *p;
  char **value_local;
  
  __s = *value;
  sVar2 = strlen(__s);
  if ((8 < sVar2) && (iVar1 = strncmp(__s,"critical,",9), iVar1 == 0)) {
    local_20 = (byte *)(__s + 9);
    while (iVar1 = OPENSSL_isspace((uint)*local_20), iVar1 != 0) {
      local_20 = local_20 + 1;
    }
    *value = (char *)local_20;
    return 1;
  }
  return 0;
}

Assistant:

static int v3_check_critical(const char **value) {
  const char *p = *value;
  if ((strlen(p) < 9) || strncmp(p, "critical,", 9)) {
    return 0;
  }
  p += 9;
  while (OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  *value = p;
  return 1;
}